

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (factor != 1) {
    if (factor == 0) {
      this->used_bigits_ = 0;
      this->exponent_ = 0;
      return;
    }
    uVar1 = this->used_bigits_;
    if ((ulong)uVar1 != 0) {
      if ((short)uVar1 < 1) {
        uVar3 = 0;
      }
      else {
        uVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = (ulong)this->bigits_buffer_[uVar5] * (ulong)factor + uVar3;
          this->bigits_buffer_[uVar5] = (uint)uVar3 & 0xfffffff;
          uVar3 = uVar3 >> 0x1c;
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      if (uVar3 != 0) {
        lVar4 = (long)this->used_bigits_;
        do {
          if (0x7f < (short)lVar4) {
            abort();
          }
          this->bigits_buffer_[lVar4] = (uint)uVar3 & 0xfffffff;
          lVar4 = lVar4 + 1;
          this->used_bigits_ = (int16_t)lVar4;
          bVar2 = 0xfffffff < uVar3;
          uVar3 = uVar3 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(const uint32_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  DOUBLE_CONVERSION_ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * RawBigit(i) + carry;
    RawBigit(i) = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}